

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_4.cpp
# Opt level: O3

void __thiscall Date::increment_day(Date *this)

{
  Month MVar1;
  uint uVar2;
  int iVar3;
  Month MVar4;
  int iVar5;
  
  MVar1 = this->m;
  if (MVar1 < (dec|jan)) {
    iVar3 = 0x1f;
    if ((0x15aaU >> (MVar1 & 0x1f) & 1) != 0) goto LAB_001025e1;
    if (MVar1 == feb) {
      uVar2 = this->y;
      if (((uVar2 & 3) != 0) ||
         ((iVar3 = 0x1d, (uVar2 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000) < 0x28f5c29 &&
          (uVar2 != ((int)uVar2 / 400) * 400)))) {
        iVar3 = 0x1c;
      }
      goto LAB_001025e1;
    }
  }
  iVar3 = 0x1e;
LAB_001025e1:
  iVar5 = this->d + 1;
  if (this->d == iVar3) {
    iVar5 = 1;
  }
  this->d = iVar5;
  if (iVar5 == 1) {
    MVar4 = MVar1 + jan;
    if (MVar1 == dec) {
      MVar4 = jan;
    }
    this->m = MVar4;
    if (MVar4 == jan) {
      this->y = this->y + 1;
    }
  }
  return;
}

Assistant:

void Date::increment_day()
{
	switch (m)
	{
	case Month::feb:
	{
		if (is_leap(*this))
			d = next_val(29, d);
		else
			d = next_val(28, d);
		break;
	}
	case Month::jan:
	case Month::mar:
	case Month::may:
	case Month::jul:
	case Month::aug:
	case Month::oct:
	case Month::dec:
		d = next_val(31, d);
		break;
	default:
		d = next_val(30, d);
	}

	// handles case when next day is the first day of next month
	if (d == 1)
	{
		m = Month(next_val(12, int(m)));
		if (m == Month::jan)
			++y;
	}
}